

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O2

int mdef_phone_id(mdef_t *m,int ci,int lc,int rc,word_posn_t wpos)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  ph_lc_t *ppVar4;
  ph_rc_t *ppVar5;
  uint rc_00;
  bool bVar6;
  
  if (m == (mdef_t *)0x0) {
    __assert_fail("m",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                  ,0xdf,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
  }
  if ((ci < 0) || (iVar2 = m->n_ciphone, iVar2 <= ci)) {
    __assert_fail("(ci >= 0) && (ci < m->n_ciphone)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                  ,0xe0,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
  }
  do {
    rc_00 = rc;
    if ((lc < 0) || (iVar2 <= lc)) {
      __assert_fail("(lc >= 0) && (lc < m->n_ciphone)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                    ,0xe1,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
    }
    if (((int)rc_00 < 0) || (iVar2 <= (int)rc_00)) {
      __assert_fail("(rc >= 0) && (rc < m->n_ciphone)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                    ,0xe2,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
    }
    if (WORD_POSN_SINGLE < wpos) {
      __assert_fail("(wpos >= 0) && (wpos < N_WORD_POSN)",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                    ,0xe3,"int mdef_phone_id(mdef_t *, int, int, int, word_posn_t)");
    }
    ppVar4 = find_ph_lc(m->wpos_ci_lclist[wpos][(uint)ci],lc);
    if ((ppVar4 != (ph_lc_t *)0x0) &&
       (ppVar5 = find_ph_rc(ppVar4->rclist,rc_00), ppVar5 != (ph_rc_t *)0x0)) {
      return ppVar5->pid;
    }
    sVar1 = m->sil;
    if (sVar1 < 0) {
      return -1;
    }
    uVar3 = (int)sVar1;
    if (m->ciphone[(uint)lc].filler == 0) {
      uVar3 = lc;
    }
    rc = (int)sVar1;
    if (m->ciphone[rc_00].filler == 0) {
      rc = rc_00;
    }
    bVar6 = uVar3 != lc;
    lc = uVar3;
  } while ((bVar6) || (rc != rc_00));
  return -1;
}

Assistant:

int
mdef_phone_id(mdef_t * m,
              int ci, int lc, int rc, word_posn_t wpos)
{
    ph_lc_t *lcptr;
    ph_rc_t *rcptr;
    int newl, newr;

    assert(m);
    assert((ci >= 0) && (ci < m->n_ciphone));
    assert((lc >= 0) && (lc < m->n_ciphone));
    assert((rc >= 0) && (rc < m->n_ciphone));
    assert((wpos >= 0) && (wpos < N_WORD_POSN));

    if (((lcptr =
          find_ph_lc(m->wpos_ci_lclist[wpos][(int) ci], lc)) == NULL)
        || ((rcptr = find_ph_rc(lcptr->rclist, rc)) == NULL)) {
        /* Not found; backoff to silence context if non-silence filler context */
        if (m->sil < 0)
            return -1;

        newl = m->ciphone[(int) lc].filler ? m->sil : lc;
        newr = m->ciphone[(int) rc].filler ? m->sil : rc;
        if ((newl == lc) && (newr == rc))
            return -1;

        return (mdef_phone_id(m, ci, newl, newr, wpos));
    }

    return (rcptr->pid);
}